

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# basis.cc
# Opt level: O0

Vector ipx::CopyBasic(Vector *x,Basis *basis)

{
  Int IVar1;
  Int IVar2;
  Model *this;
  double *pdVar3;
  Basis *in_RDX;
  double *extraout_RDX;
  double *extraout_RDX_00;
  valarray<double> *in_RSI;
  valarray<double> *in_RDI;
  Vector VVar4;
  Int p;
  Int m;
  Vector *xbasic;
  undefined4 in_stack_ffffffffffffff88;
  Int in_stack_ffffffffffffff8c;
  Basis *in_stack_ffffffffffffff90;
  undefined4 local_24;
  
  this = Basis::model(in_RDX);
  IVar1 = Model::rows(this);
  std::valarray<double>::valarray
            ((valarray<double> *)in_stack_ffffffffffffff90,
             CONCAT44(in_stack_ffffffffffffff8c,in_stack_ffffffffffffff88));
  pdVar3 = extraout_RDX;
  for (local_24 = 0; local_24 < IVar1; local_24 = local_24 + 1) {
    IVar2 = Basis::operator[](in_stack_ffffffffffffff90,in_stack_ffffffffffffff8c);
    pdVar3 = std::valarray<double>::operator[](in_RSI,(long)IVar2);
    in_stack_ffffffffffffff90 = (Basis *)*pdVar3;
    pdVar3 = std::valarray<double>::operator[](in_RDI,(long)local_24);
    *pdVar3 = (double)in_stack_ffffffffffffff90;
    pdVar3 = extraout_RDX_00;
  }
  VVar4._M_data = pdVar3;
  VVar4._M_size = (size_t)in_RDI;
  return VVar4;
}

Assistant:

Vector CopyBasic(const Vector& x, const Basis& basis) {
    const Int m = basis.model().rows();
    Vector xbasic(m);
    for (Int p = 0; p < m; p++)
        xbasic[p] = x[basis[p]];
    return xbasic;
}